

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superstep.hpp
# Opt level: O0

int __thiscall
Superstep<int>::runStep
          (Superstep<int> *this,vector<WorkerThread,_std::allocator<WorkerThread>_> *workers,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *inputVectors,
          vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *outputVectors)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  runtime_error *prVar5;
  WorkerThread *this_00;
  WorkerThread *pWVar6;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>
  *__fn;
  Barrier *this_01;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDX;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *in_RSI;
  long in_RDI;
  packaged_task<void_()> packagedTask;
  type boundedFunction;
  anon_class_8_1_8991fb9c_for__M_f lambdaFunction;
  size_t i;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *in_stack_ffffffffffffff08;
  function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
  *in_stack_ffffffffffffff10;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff18;
  reference in_stack_ffffffffffffff20;
  anon_class_8_1_8991fb9c_for__M_f *in_stack_ffffffffffffff28;
  Barrier *in_stack_ffffffffffffff40;
  Task *in_stack_ffffffffffffff48;
  anon_class_8_1_8991fb9c_for__M_f local_90 [2];
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_80 [2];
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)> local_60
  ;
  ulong local_38;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_18;
  vector<WorkerThread,_std::allocator<WorkerThread>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::vector<WorkerThread,_std::allocator<WorkerThread>_>::size(in_RSI);
  sVar4 = std::
          vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          ::size((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                  *)(in_RDI + 8));
  if (sVar3 < sVar4) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,
               "Mismatching between number of workers and number of activities! (#workers < #activities)"
              );
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (WorkerThread *)
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(local_18);
  pWVar6 = (WorkerThread *)
           std::
           vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
           ::size((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                   *)(in_RDI + 8));
  if (this_00 < pWVar6) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,
               "Mismatching between number of activities and number of input queues! (#activities > #queues)"
              );
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __fn = (_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dima91[P]BSP_pattern_include_superstep_hpp:178:25)_(unsigned_long,_std::reference_wrapper<std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>)>
          *)(in_RDI + 0xe0);
  std::
  vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ::size((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          *)(in_RDI + 8));
  Barrier::reset(in_stack_ffffffffffffff40,(int)((ulong)__fn >> 0x20));
  this_01 = (Barrier *)(in_RDI + 0x80);
  std::
  vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
  ::size((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
          *)(in_RDI + 8));
  Barrier::reset(this_01,(int)((ulong)__fn >> 0x20));
  Barrier::reset(this_01,(int)((ulong)__fn >> 0x20));
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    sVar3 = std::
            vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
            ::size((vector<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>,_std::allocator<std::pair<std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>,_std::function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>_>_>_>
                    *)(in_RDI + 8));
    if (sVar3 <= uVar1) break;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](local_18,local_38);
    local_68 = (vector<int,_std::allocator<int>_> *)
               std::ref<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff08);
    local_70 = (vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> *)
               std::ref<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>
                         (in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff10 = &local_60;
    std::
    bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_&,unsigned_long&,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>>
              (in_stack_ffffffffffffff28,(unsigned_long *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,
               (reference_wrapper<std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_>
                *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff18 = local_80;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<Superstep<int>::runStep(std::vector<WorkerThread,std::allocator<WorkerThread>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)::_lambda(int,std::vector<int,std::allocator<int>>&,std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>&)_1_(unsigned_long,std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<LockableVector<int>,std::allocator<LockableVector<int>>>>)>&,void>
              ((packaged_task<void_()> *)this_01,__fn);
    in_stack_ffffffffffffff20 =
         std::vector<WorkerThread,_std::allocator<WorkerThread>_>::operator[](local_10,local_38);
    in_stack_ffffffffffffff28 = local_90;
    std::packaged_task<void_()>::packaged_task
              ((packaged_task<void_()> *)in_stack_ffffffffffffff10,
               (packaged_task<void_()> *)in_stack_ffffffffffffff08);
    WorkerThread::assignActivity(this_00,in_stack_ffffffffffffff48);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)in_stack_ffffffffffffff20)
    ;
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)in_stack_ffffffffffffff20)
    ;
    local_38 = local_38 + 1;
  }
  Barrier::decreaseBarrier(this_01);
  Barrier::waitForFinish(this_01);
  iVar2 = std::
          function<int_(std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>_&)>
          ::operator()(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  return iVar2;
}

Assistant:

int Superstep<T>::runStep (std::vector<WorkerThread> &workers,
							std::vector<std::vector<T>>	&inputVectors,
							std::vector<LockableVector<T>> &outputVectors) {

	if (workers.size () < activitiesFunctions.size()) {
		throw std::runtime_error ("Mismatching between number of workers and number of activities! (#workers < #activities)");
	}
	if (inputVectors.size() < activitiesFunctions.size())
		throw std::runtime_error ("Mismatching between number of activities and number of input queues! (#activities > #queues)");

	// Resetting bariers
	commPhaseBarrier.reset (activitiesFunctions.size());
	compPhaseBarrier.reset (activitiesFunctions.size());
	startBarrier.reset (1);


	// Setting up worker threads
	for (size_t i=0; i<activitiesFunctions.size(); i++) {
		// Binding packaged task to arguments
		auto lambdaFunction	= [&] (int index, std::vector<T> &inputItems, std::vector<LockableVector<T>> &outputItems) {
			workerFunction (index, inputItems, outputItems);
		};
		auto boundedFunction	= std::bind (lambdaFunction, i, std::ref(inputVectors[i]), std::ref(outputVectors));
		auto packagedTask		= std::packaged_task<void()> (boundedFunction);

		// Assigning created packaged_task to a worker
		workers[i].assignActivity (std::move(packagedTask));
	}

	// Starting workers and waiting for their completion
	startBarrier.decreaseBarrier ();
	commPhaseBarrier.waitForFinish ();
	
	return atExitF (outputVectors);
}